

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cJSON_add_array_should_add_array(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *array;
  cJSON *root;
  
  object = cJSON_CreateObject();
  cJSON_AddArrayToObject(object,"array");
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"array");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x18c);
  }
  UnityAssertEqualNumber((long)pcVar1->type,0x20,(char *)0x0,0x18d,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cJSON_add_array_should_add_array(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *array = NULL;

    cJSON_AddArrayToObject(root, "array");
    TEST_ASSERT_NOT_NULL(array = cJSON_GetObjectItemCaseSensitive(root, "array"));
    TEST_ASSERT_EQUAL_INT(array->type, cJSON_Array);

    cJSON_Delete(root);
}